

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Metadata::SerializeWithCachedSizes(Metadata *this,CodedOutputStream *output)

{
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *key;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  string *psVar6;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar7;
  size_type sVar8;
  ulong uVar9;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **ppMVar10;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **ppMVar11;
  const_pointer key_00;
  const_pointer pvVar12;
  EntryType *pEVar13;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar14;
  const_reference pvVar15;
  const_iterator local_c0;
  undefined1 local_a8 [8];
  const_iterator it_1;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
  entry_1;
  size_type i;
  scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
  entry;
  const_iterator local_70;
  undefined1 local_48 [8];
  const_iterator it;
  size_type n;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  items;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Metadata *this_local;
  
  items.array_._4_4_ = 0;
  shortdescription_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    shortdescription_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    shortdescription_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.shortDescription");
    psVar6 = shortdescription_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar6,output);
  }
  versionstring_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    versionstring_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    versionstring_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.versionString");
    psVar6 = versionstring_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,psVar6,output);
  }
  author_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    author_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    author_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.author");
    psVar6 = author_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(3,psVar6,output);
  }
  license_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    license_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    license_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.license");
    psVar6 = license_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(4,psVar6,output);
  }
  pMVar7 = userdefined_abi_cxx11_(this);
  bVar2 = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty(pMVar7);
  if (!bVar2) {
    bVar2 = google::protobuf::io::CodedOutputStream::IsSerializationDeterministic(output);
    if (bVar2) {
      pMVar7 = userdefined_abi_cxx11_(this);
      sVar8 = google::protobuf::
              Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(pMVar7);
      if (1 < sVar8) {
        pMVar7 = userdefined_abi_cxx11_(this);
        sVar8 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size(pMVar7);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar8;
        uVar9 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar9 = 0xffffffffffffffff;
        }
        ppMVar10 = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    **)operator_new__(uVar9);
        google::protobuf::internal::
        scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::scoped_array((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                        *)&n,ppMVar10);
        it.it_.bucket_index_ = 0;
        pMVar7 = userdefined_abi_cxx11_(this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::begin((const_iterator *)local_48,pMVar7);
        while( true ) {
          pMVar7 = userdefined_abi_cxx11_(this);
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::end(&local_70,pMVar7);
          bVar2 = google::protobuf::operator!=((const_iterator *)local_48,&local_70);
          if (!bVar2) break;
          pvVar15 = google::protobuf::
                    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::const_iterator::operator*((const_iterator *)local_48);
          ppMVar10 = google::protobuf::internal::
                     scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                     ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                   *)&n,it.it_.bucket_index_);
          *ppMVar10 = pvVar15;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator++((const_iterator *)local_48);
          it.it_.bucket_index_ = it.it_.bucket_index_ + 1;
        }
        ppMVar10 = google::protobuf::internal::
                   scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                   ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                 *)&n,0);
        ppMVar11 = google::protobuf::internal::
                   scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                   ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                 *)&n,it.it_.bucket_index_);
        std::
        sort<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>
                  (ppMVar10,ppMVar11);
        google::protobuf::internal::
        scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
        ::scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                      *)&i,(MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                            *)0x0);
        for (entry_1.ptr_ = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                             *)0x0; entry_1.ptr_ < it.it_.bucket_index_;
            entry_1.ptr_ = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                            *)((long)&((entry_1.ptr_)->
                                      super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                                      ).super_MessageLite._vptr_MessageLite + 1)) {
          ppMVar10 = google::protobuf::internal::
                     scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                     ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                   *)&n,(ptrdiff_t)entry_1.ptr_);
          key = *ppMVar10;
          ppMVar10 = google::protobuf::internal::
                     scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                     ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                   *)&n,(ptrdiff_t)entry_1.ptr_);
          pEVar13 = google::protobuf::internal::
                    MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                    ::NewEntryWrapper(&this->userdefined_,&key->first,&(*ppMVar10)->second);
          google::protobuf::internal::
          scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
          ::reset((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                   *)&i,pEVar13);
          pMVar14 = google::protobuf::internal::
                    scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                    ::operator*((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                                 *)&i);
          google::protobuf::internal::WireFormatLite::WriteMessage
                    (100,(MessageLite *)pMVar14,output);
          ppMVar10 = google::protobuf::internal::
                     scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                     ::operator[]((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                                   *)&n,(ptrdiff_t)entry_1.ptr_);
          SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__
                    (*ppMVar10);
        }
        google::protobuf::internal::
        scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
        ::~scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                       *)&i);
        google::protobuf::internal::
        scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::~scoped_array((scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                         *)&n);
        return;
      }
    }
    google::protobuf::internal::
    scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
    ::scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                  *)&it_1.it_.bucket_index_,
                 (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                  *)0x0);
    pMVar7 = userdefined_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::begin((const_iterator *)local_a8,pMVar7);
    while( true ) {
      pMVar7 = userdefined_abi_cxx11_(this);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end(&local_c0,pMVar7);
      bVar2 = google::protobuf::operator!=((const_iterator *)local_a8,&local_c0);
      if (!bVar2) break;
      key_00 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::const_iterator::operator->((const_iterator *)local_a8);
      pvVar12 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::const_iterator::operator->((const_iterator *)local_a8);
      pEVar13 = google::protobuf::internal::
                MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                ::NewEntryWrapper(&this->userdefined_,&key_00->first,&pvVar12->second);
      google::protobuf::internal::
      scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
      ::reset((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
               *)&it_1.it_.bucket_index_,pEVar13);
      pMVar14 = google::protobuf::internal::
                scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                ::operator*((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                             *)&it_1.it_.bucket_index_);
      google::protobuf::internal::WireFormatLite::WriteMessage(100,(MessageLite *)pMVar14,output);
      pvVar15 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::const_iterator::operator*((const_iterator *)local_a8);
      SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__(pvVar15);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::const_iterator::operator++((const_iterator *)local_a8);
    }
    google::protobuf::internal::
    scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
    ::~scoped_ptr((scoped_ptr<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                   *)&it_1.it_.bucket_index_);
  }
  return;
}

Assistant:

void Metadata::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Metadata)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string shortDescription = 1;
  if (this->shortdescription().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->shortdescription().data(), this->shortdescription().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.shortDescription");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->shortdescription(), output);
  }

  // string versionString = 2;
  if (this->versionstring().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->versionstring().data(), this->versionstring().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.versionString");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->versionstring(), output);
  }

  // string author = 3;
  if (this->author().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->author().data(), this->author().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.author");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->author(), output);
  }

  // string license = 4;
  if (this->license().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->license().data(), this->license().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.license");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      4, this->license(), output);
  }

  // map<string, string> userDefined = 100;
  if (!this->userdefined().empty()) {
    typedef ::google::protobuf::Map< ::std::string, ::std::string >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), p->first.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), p->second.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }
    };

    if (output->IsSerializationDeterministic() &&
        this->userdefined().size() > 1) {
      ::google::protobuf::scoped_array<SortItem> items(
          new SortItem[this->userdefined().size()]);
      typedef ::google::protobuf::Map< ::std::string, ::std::string >::size_type size_type;
      size_type n = 0;
      for (::google::protobuf::Map< ::std::string, ::std::string >::const_iterator
          it = this->userdefined().begin();
          it != this->userdefined().end(); ++it, ++n) {
        items[n] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[n], Less());
      ::google::protobuf::scoped_ptr<Metadata_UserDefinedEntry> entry;
      for (size_type i = 0; i < n; i++) {
        entry.reset(userdefined_.NewEntryWrapper(
            items[i]->first, items[i]->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            100, *entry, output);
        Utf8Check::Check(items[i]);
      }
    } else {
      ::google::protobuf::scoped_ptr<Metadata_UserDefinedEntry> entry;
      for (::google::protobuf::Map< ::std::string, ::std::string >::const_iterator
          it = this->userdefined().begin();
          it != this->userdefined().end(); ++it) {
        entry.reset(userdefined_.NewEntryWrapper(
            it->first, it->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            100, *entry, output);
        Utf8Check::Check(&*it);
      }
    }
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Metadata)
}